

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O1

void __thiscall ExternalCodeEditor::~ExternalCodeEditor(ExternalCodeEditor *this)

{
  if (G_debug != 0) {
    printf("ExternalCodeEditor() DTOR CALLED (this=%p, pid=%ld)\n",this,(long)this->pid_);
  }
  close_editor(this);
  if (this->filename_ != (char *)0x0) {
    free(this->filename_);
  }
  this->filename_ = (char *)0x0;
  return;
}

Assistant:

ExternalCodeEditor::~ExternalCodeEditor() {
  if ( G_debug )
    printf("ExternalCodeEditor() DTOR CALLED (this=%p, pid=%ld)\n",
           (void*)this, (long)pid_);
  close_editor();   // close editor, delete tmp file
  set_filename(0);  // free()s filename
}